

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Student.cpp
# Opt level: O0

ostream * L14_2::operator<<(ostream *os,Student *stu)

{
  ostream *poVar1;
  Student *stu_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"Scores for ");
  poVar1 = std::operator<<(poVar1,(string *)stu);
  std::operator<<(poVar1,":\n");
  Student::output(stu,os);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream &os, const Student &stu) {
        os << "Scores for " << (std::string &)stu << ":\n";
        stu.output(os);
        return os;
    }